

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Exception * __thiscall pstack::Exception::operator<<(Exception *this,char **o)

{
  ostream *poVar1;
  char **o_local;
  Exception *this_local;
  
  poVar1 = getStream(this);
  std::operator<<(poVar1,*o);
  return this;
}

Assistant:

const Exception &operator << (const T& o) const {
       getStream() << o;
       return *this;
    }